

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::LayoutBindingBaseCase::buildLayout_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int binding)

{
  ostringstream bindingStr;
  long *local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,binding);
  std::__cxx11::stringbuf::str();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (__return_storage_ptr__,this,local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildLayout(int binding)
	{
		std::ostringstream bindingStr;
		bindingStr << binding;
		return buildLayout(bindingStr.str());
	}